

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O2

void __thiscall czh::lexer::Match::match(Match *this,TokenType *token)

{
  TokenType TVar1;
  Match MVar2;
  undefined8 extraout_RAX;
  State SVar3;
  allocator<char> local_41;
  source_location local_40;
  string local_38;
  
  TVar1 = *token;
  if (TVar1 == NOTE) {
    return;
  }
  SVar3 = this->state;
LAB_00119244:
  switch(SVar3) {
  case INIT:
    goto switchD_00119256_caseD_0;
  case ID:
    if (TVar1 == COLON) goto switchD_0011934c_caseD_1;
    if (TVar1 == EQUAL) {
      this->state = EQUAL;
      return;
    }
    MVar2.state = UNEXPECTED;
    MVar2.last_state = ID;
    break;
  case VALUE:
  case ARR_RP:
  case SC_COLON:
  case UNEXPECTED:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Something unreachable.",&local_41);
    local_40._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_00195358;
    czh::error::czh_unreachable(&local_38,&local_40);
  default:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Something unreachable.",&local_41);
    local_40._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_00195388;
    czh::error::czh_unreachable(&local_38,&local_40);
    std::__cxx11::string::~string((string *)&local_38);
    _Unwind_Resume(extraout_RAX);
  case ARR_VALUE:
    if (TVar1 == ARR_RP) goto switchD_0011934c_caseD_1;
    if (TVar1 == COMMA) {
      this->state = COMMA;
      return;
    }
    MVar2.state = UNEXPECTED;
    MVar2.last_state = ARR_VALUE;
    break;
  case EQUAL:
    switch(TVar1) {
    case ID:
switchD_0011934c_caseD_0:
      this->state = REF_ID;
      return;
    case VALUE:
      goto switchD_0011934c_caseD_1;
    default:
      MVar2.state = UNEXPECTED;
      MVar2.last_state = EQUAL;
      break;
    case ARR_LP:
      this->state = ARR_LP;
      return;
    case REF:
switchD_0011934c_caseD_7:
      this->state = REF;
      return;
    }
    break;
  case ARR_LP:
    if (TVar1 == ARR_RP) goto switchD_0011934c_caseD_1;
    if (TVar1 == VALUE) {
LAB_001192fc:
      this->state = ARR_VALUE;
      return;
    }
    MVar2.state = UNEXPECTED;
    MVar2.last_state = ARR_LP;
    break;
  case COMMA:
    if (TVar1 == VALUE) goto LAB_001192fc;
    MVar2.state = UNEXPECTED;
    MVar2.last_state = COMMA;
    break;
  case REF:
    if (TVar1 == ID) goto switchD_0011934c_caseD_0;
    MVar2.state = UNEXPECTED;
    MVar2.last_state = REF;
    break;
  case REF_ID:
    if (TVar1 - FEND < 2) goto LAB_001192b5;
    if (TVar1 == REF) goto switchD_0011934c_caseD_7;
    this->state = INIT;
    this->last_state = UNEXPECTED;
    SVar3 = INIT;
    goto LAB_00119244;
  case END:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Unexpected end of file.",&local_41);
    local_40._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_00195370;
    czh::error::czh_assert((TVar1 & ~VALUE) == FEND,&local_38,&local_40);
    std::__cxx11::string::~string((string *)&local_38);
LAB_001192b5:
    this->state = INIT;
    this->last_state = UNEXPECTED;
    return;
  }
  *this = MVar2;
  return;
switchD_00119256_caseD_0:
  if (TVar1 != SCEND) {
    if (TVar1 != ID) {
      this->state = UNEXPECTED;
      this->last_state = INIT;
      return;
    }
    this->state = ID;
    return;
  }
switchD_0011934c_caseD_1:
  this->state = END;
  return;
}

Assistant:

void match(const token::TokenType &token)
    {
      if (token == token::TokenType::NOTE) return;
      switch (state)
      {
        case State::INIT:
          switch (token)
          {
            case token::TokenType::ID:
              state = State::ID;
              break;
            case token::TokenType::SCEND:
              state = State::END;
              break;
            default:
              last_state = state;
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::ID:
          switch (token)
          {
            case token::TokenType::EQUAL:
              state = State::EQUAL;
              break;
            case token::TokenType::COLON:
              state = State::END;
              break;
            default:
              last_state = state;
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::EQUAL:
          switch (token)
          {
            case token::TokenType::VALUE:
              state = State::END;
              break;
            case token::TokenType::ARR_LP:
              state = State::ARR_LP;
              break;
            case token::TokenType::REF:
              state = State::REF;
              break;
            case token::TokenType::ID:
              state = State::REF_ID;
              break;
            default:
              last_state = state;
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::ARR_LP:
          switch (token)
          {
            case token::TokenType::VALUE:
              state = State::ARR_VALUE;
              break;
            case token::TokenType::ARR_RP:
              state = State::END;
              break;
            default:
              last_state = state;
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::ARR_VALUE:
          switch (token)
          {
            case token::TokenType::COMMA:
              state = State::COMMA;
              break;
            case token::TokenType::ARR_RP:
              state = State::END;
              break;
            default:
              last_state = state;
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::COMMA:
          switch (token)
          {
            case token::TokenType::VALUE:
              state = State::ARR_VALUE;
              break;
            default:
              last_state = state;
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::REF:
          switch (token)
          {
            case token::TokenType::ID:
              state = State::REF_ID;
              break;
            default:
              last_state = state;
              state = State::UNEXPECTED;
              break;
          }
          break;
        case State::REF_ID:
          switch (token)
          {
            case token::TokenType::REF:
              state = State::REF;
              break;
            case token::TokenType::SEND:
            case token::TokenType::FEND:
              reset();
              break;
            default:
              reset();
              match(token);
              break;
          }
          break;
        case State::VALUE:
        case State::ARR_RP:
        case State::SC_COLON:
        case State::UNEXPECTED:
          error::czh_unreachable();
        case State::END:
          error::czh_assert(token == token::TokenType::SEND || token == token::TokenType::FEND,
                            "Unexpected end of file.");
          reset();
          break;
        default:
          error::czh_unreachable();
      }
    }